

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

FT_Error afm_parser_read_int(AFM_Parser parser,FT_Int *aint)

{
  FT_Int FVar1;
  undefined1 local_30 [8];
  AFM_ValueRec val;
  FT_Int *aint_local;
  AFM_Parser parser_local;
  
  local_30._0_4_ = AFM_VALUE_TYPE_INTEGER;
  val.u = (anon_union_8_5_814e15a7_for_u)aint;
  FVar1 = afm_parser_read_vals(parser,(AFM_Value)local_30,1);
  if (FVar1 == 1) {
    *(AFM_ValueType_ *)val.u.s = val.type;
    parser_local._4_4_ = 0;
  }
  else {
    parser_local._4_4_ = 0xa0;
  }
  return parser_local._4_4_;
}

Assistant:

static FT_Error
  afm_parser_read_int( AFM_Parser  parser,
                       FT_Int*     aint )
  {
    AFM_ValueRec  val;


    val.type = AFM_VALUE_TYPE_INTEGER;

    if ( afm_parser_read_vals( parser, &val, 1 ) == 1 )
    {
      *aint = val.u.i;

      return FT_Err_Ok;
    }
    else
      return FT_THROW( Syntax_Error );
  }